

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O0

nghttp2_nv * Curl_dynhds_to_nva(dynhds *dynhds,size_t *pcount)

{
  dynhds_entry *pdVar1;
  dynhds_entry *e;
  size_t i;
  nghttp2_nv *nva;
  size_t *pcount_local;
  dynhds *dynhds_local;
  
  dynhds_local = (dynhds *)(*Curl_ccalloc)(1,dynhds->hds_len * 0x28);
  *pcount = 0;
  if (dynhds_local == (dynhds *)0x0) {
    dynhds_local = (dynhds *)0x0;
  }
  else {
    for (e = (dynhds_entry *)0x0; e < (dynhds_entry *)dynhds->hds_len;
        e = (dynhds_entry *)((long)&e->name + 1)) {
      pdVar1 = dynhds->hds[(long)e];
      (&dynhds_local->hds)[(long)e * 5] = (dynhds_entry **)pdVar1->name;
      (&dynhds_local->hds_allc)[(long)e * 5] = pdVar1->namelen;
      (&dynhds_local->hds_len)[(long)e * 5] = (size_t)pdVar1->value;
      (&dynhds_local->max_entries)[(long)e * 5] = pdVar1->valuelen;
      *(undefined1 *)(&dynhds_local->strs_len + (long)e * 5) = 0;
    }
    *pcount = dynhds->hds_len;
  }
  return (nghttp2_nv *)dynhds_local;
}

Assistant:

nghttp2_nv *Curl_dynhds_to_nva(struct dynhds *dynhds, size_t *pcount)
{
  nghttp2_nv *nva = calloc(1, sizeof(nghttp2_nv) * dynhds->hds_len);
  size_t i;

  *pcount = 0;
  if(!nva)
    return NULL;

  for(i = 0; i < dynhds->hds_len; ++i) {
    struct dynhds_entry *e = dynhds->hds[i];
    DEBUGASSERT(e);
    nva[i].name = (unsigned char *)e->name;
    nva[i].namelen = e->namelen;
    nva[i].value = (unsigned char *)e->value;
    nva[i].valuelen = e->valuelen;
    nva[i].flags = NGHTTP2_NV_FLAG_NONE;
  }
  *pcount = dynhds->hds_len;
  return nva;
}